

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O2

void __thiscall
inja::IfStatementNode::IfStatementNode
          (IfStatementNode *this,bool is_nested,BlockNode *parent,size_t pos)

{
  (this->super_StatementNode).super_AstNode.pos = pos;
  (this->super_StatementNode).super_AstNode._vptr_AstNode = (_func_int **)&PTR_accept_0019c688;
  (this->condition).super_AstNode.pos = 0;
  (this->condition).super_AstNode._vptr_AstNode = (_func_int **)&PTR_accept_0019c6e0;
  (this->condition).root.super___shared_ptr<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->condition).root.super___shared_ptr<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->true_statement).super_AstNode.pos = 0;
  (this->true_statement).super_AstNode._vptr_AstNode = (_func_int **)&PTR_accept_0019c120;
  (this->true_statement).nodes.
  super__Vector_base<std::shared_ptr<inja::AstNode>,_std::allocator<std::shared_ptr<inja::AstNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->true_statement).nodes.
  super__Vector_base<std::shared_ptr<inja::AstNode>,_std::allocator<std::shared_ptr<inja::AstNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->true_statement).nodes.
  super__Vector_base<std::shared_ptr<inja::AstNode>,_std::allocator<std::shared_ptr<inja::AstNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->false_statement).super_AstNode.pos = 0;
  (this->false_statement).super_AstNode._vptr_AstNode = (_func_int **)&PTR_accept_0019c120;
  (this->false_statement).nodes.
  super__Vector_base<std::shared_ptr<inja::AstNode>,_std::allocator<std::shared_ptr<inja::AstNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->false_statement).nodes.
  super__Vector_base<std::shared_ptr<inja::AstNode>,_std::allocator<std::shared_ptr<inja::AstNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->false_statement).nodes.
  super__Vector_base<std::shared_ptr<inja::AstNode>,_std::allocator<std::shared_ptr<inja::AstNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->parent = parent;
  this->is_nested = is_nested;
  this->has_false_statement = false;
  return;
}

Assistant:

AstNode(size_t pos): pos(pos) {}